

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_maximum_likelihood_parameter_generation.cc
# Opt level: O0

void __thiscall
sptk::RecursiveMaximumLikelihoodParameterGeneration::RecursiveMaximumLikelihoodParameterGeneration
          (RecursiveMaximumLikelihoodParameterGeneration *this,int num_order,int num_past_frame,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *window_coefficients,InputSourceInterface *input_source)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  pointer this_00;
  size_type sVar5;
  undefined4 in_EDX;
  undefined4 in_ESI;
  InputSourceInterface *in_RDI;
  _func_int **in_R8;
  int static_and_dynamic_size;
  int i;
  int half_window_width;
  int window_width;
  iterator itr;
  int max_half_window_width;
  RecursiveMaximumLikelihoodParameterGeneration *in_stack_00000100;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff38;
  Buffer *in_stack_ffffffffffffff40;
  vector<double,_std::allocator<double>_> *this_01;
  undefined6 in_stack_ffffffffffffff48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff88;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff90;
  int local_58;
  __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_38;
  int local_30;
  _func_int **local_20;
  undefined4 local_10;
  undefined4 local_c;
  
  local_20 = in_R8;
  local_10 = in_EDX;
  local_c = in_ESI;
  InputSourceInterface::InputSourceInterface(in_RDI);
  in_RDI->_vptr_InputSourceInterface =
       (_func_int **)&PTR__RecursiveMaximumLikelihoodParameterGeneration_0013ab88;
  *(undefined4 *)&in_RDI[1]._vptr_InputSourceInterface = local_c;
  *(undefined4 *)((long)&in_RDI[1]._vptr_InputSourceInterface + 4) = local_10;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  in_RDI[5]._vptr_InputSourceInterface = local_20;
  *(undefined1 *)&in_RDI[6]._vptr_InputSourceInterface = 1;
  __first._M_current = (double *)(in_RDI + 8);
  Buffer::Buffer(in_stack_ffffffffffffff40);
  if ((((*(int *)&in_RDI[1]._vptr_InputSourceInterface < 0) ||
       (*(int *)((long)&in_RDI[1]._vptr_InputSourceInterface + 4) < 0)) ||
      (in_RDI[5]._vptr_InputSourceInterface == (_func_int **)0x0)) ||
     (bVar1 = (**(code **)(*in_RDI[5]._vptr_InputSourceInterface + 0x18))(), (bVar1 & 1) == 0)) {
    *(undefined1 *)&in_RDI[6]._vptr_InputSourceInterface = 0;
  }
  else {
    local_30 = 0;
    local_38._M_current =
         (vector<double,_std::allocator<double>_> *)
         std::
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)in_stack_ffffffffffffff38);
    while( true ) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_ffffffffffffff38);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                          *)in_stack_ffffffffffffff40,
                         (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                          *)in_stack_ffffffffffffff38);
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                ::operator->(&local_38);
      sVar5 = std::vector<double,_std::allocator<double>_>::size(this_00);
      if ((int)sVar5 % 2 == 0) {
        __gnu_cxx::
        __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator->(&local_38);
        std::vector<double,_std::allocator<double>_>::push_back
                  (&in_stack_ffffffffffffff40->static_and_dynamic_parameters,
                   (value_type *)in_stack_ffffffffffffff38);
      }
      iVar4 = (int)sVar5 / 2;
      if (local_30 < iVar4) {
        local_30 = iVar4;
      }
      __gnu_cxx::
      __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator++(&local_38);
    }
    if (*(int *)((long)&in_RDI[1]._vptr_InputSourceInterface + 4) < local_30) {
      *(undefined1 *)&in_RDI[6]._vptr_InputSourceInterface = 0;
    }
    else {
      *(int *)((long)&in_RDI[6]._vptr_InputSourceInterface + 4) =
           *(int *)((long)&in_RDI[1]._vptr_InputSourceInterface + 4) + 1 + local_30;
      *(undefined4 *)&in_RDI[7]._vptr_InputSourceInterface =
           *(undefined4 *)((long)&in_RDI[6]._vptr_InputSourceInterface + 4);
      *(undefined4 *)((long)&in_RDI[7]._vptr_InputSourceInterface + 4) =
           *(undefined4 *)((long)&in_RDI[1]._vptr_InputSourceInterface + 4);
      for (local_58 = 1; local_58 < *(int *)((long)&in_RDI[6]._vptr_InputSourceInterface + 4);
          local_58 = local_58 + 1) {
        bVar3 = (**(code **)(*local_20 + 0x20))(local_20,in_RDI + 8);
        if ((bVar3 & 1) == 0) {
          this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 8);
          std::vector<double,_std::allocator<double>_>::size(this_01);
          std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
          std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                    CONCAT17(bVar1,CONCAT16(bVar3,in_stack_ffffffffffffff48)),
                    (difference_type)this_01);
          __last._M_current._6_1_ = bVar3;
          __last._M_current._0_6_ = in_stack_ffffffffffffff48;
          __last._M_current._7_1_ = bVar1;
          std::
          fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    (__first,__last,(double *)this_01);
          in_stack_ffffffffffffff38 = (vector<double,_std::allocator<double>_> *)(in_RDI + 8);
          std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                    CONCAT17(bVar1,CONCAT16(bVar3,in_stack_ffffffffffffff48)),
                    (difference_type)this_01);
          std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
          __last_00._M_current._6_1_ = bVar3;
          __last_00._M_current._0_6_ = in_stack_ffffffffffffff48;
          __last_00._M_current._7_1_ = bVar1;
          std::
          fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    (__first,__last_00,(double *)this_01);
          *(int *)&in_RDI[7]._vptr_InputSourceInterface =
               *(int *)&in_RDI[7]._vptr_InputSourceInterface + -1;
        }
        Forward(in_stack_00000100);
      }
    }
  }
  return;
}

Assistant:

RecursiveMaximumLikelihoodParameterGeneration::
    RecursiveMaximumLikelihoodParameterGeneration(
        int num_order, int num_past_frame,
        const std::vector<std::vector<double> >& window_coefficients,
        InputSourceInterface* input_source)
    : num_order_(num_order),
      num_past_frame_(num_past_frame),
      window_coefficients_(window_coefficients),
      input_source_(input_source),
      is_valid_(true) {
  if (num_order_ < 0 || num_past_frame_ < 0 || NULL == input_source_ ||
      !input_source_->IsValid()) {
    is_valid_ = false;
    return;
  }

  int max_half_window_width(0);
  for (std::vector<std::vector<double> >::iterator itr(
           window_coefficients_.begin());
       itr != window_coefficients_.end(); ++itr) {
    const int window_width(static_cast<int>(itr->size()));
    if (0 == window_width % 2) {
      itr->push_back(0.0);
    }
    const int half_window_width(window_width / 2);
    if (max_half_window_width < half_window_width) {
      max_half_window_width = half_window_width;
    }
  }

  if (num_past_frame_ < max_half_window_width) {
    is_valid_ = false;
    return;
  }

  // calculation_field is past + present + future.
  calculation_field_ = num_past_frame_ + 1 + max_half_window_width;
  num_remaining_frame_ = calculation_field_;
  current_frame_ = num_past_frame_;

  for (int i(1); i < calculation_field_; ++i) {
    if (!input_source->Get(&buffer_.static_and_dynamic_parameters)) {
      const int static_and_dynamic_size(
          static_cast<int>(buffer_.static_and_dynamic_parameters.size() / 2));
      // Initialize with zero mean.
      std::fill(buffer_.static_and_dynamic_parameters.begin(),
                buffer_.static_and_dynamic_parameters.begin() +
                    static_and_dynamic_size,
                0.0);
      // Initialize with infinite variance.
      std::fill(buffer_.static_and_dynamic_parameters.begin() +
                    static_and_dynamic_size,
                buffer_.static_and_dynamic_parameters.end(), kInf);
      --num_remaining_frame_;
    }
    Forward();
  }
}